

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

real __thiscall fasttext::Model::softmax(Model *this,int32_t target,real lr)

{
  real *prVar1;
  int in_ESI;
  Matrix *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  real alpha;
  real label;
  int32_t i;
  real a;
  double dVar3;
  undefined4 in_stack_ffffffffffffffe0;
  int local_14;
  
  Vector::zero((Vector *)&in_RDI[3].m_);
  computeOutputSoftmax((Model *)0x161ad0);
  for (local_14 = 0; local_14 < (int)in_RDI[4].m_; local_14 = local_14 + 1) {
    a = 0.0;
    dVar3 = 1.0;
    if (local_14 != in_ESI) {
      dVar3 = 0.0;
    }
    fVar2 = (float)dVar3;
    prVar1 = Vector::operator[]((Vector *)&in_RDI[2].n_,(long)local_14);
    fVar2 = in_XMM0_Da * (fVar2 - *prVar1);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &in_RDI[3].m_);
    Vector::addRow((Vector *)CONCAT44(fVar2,in_stack_ffffffffffffffe0),in_RDI,(int64_t)dVar3,a);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x161bad);
    Matrix::addRow((Matrix *)CONCAT44(fVar2,in_stack_ffffffffffffffe0),(Vector *)in_RDI,
                   (int64_t)dVar3,a);
  }
  prVar1 = Vector::operator[]((Vector *)&in_RDI[2].n_,(long)in_ESI);
  dVar3 = utils::log((double)(ulong)(uint)*prVar1);
  return -SUB84(dVar3,0);
}

Assistant:

real Model::softmax(int32_t target, real lr) {
  grad_.zero();
  computeOutputSoftmax();
  for (int32_t i = 0; i < osz_; i++) {
    real label = (i == target) ? 1.0 : 0.0;
    real alpha = lr * (label - output_[i]);
    grad_.addRow(*wo_, i, alpha);
    wo_->addRow(hidden_, i, alpha);
  }
  return -utils::log(output_[target]);
}